

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesmsg.cpp
# Opt level: O0

void __thiscall TrodesMsg::processArg(TrodesMsg *this,char c,binarydata *a)

{
  string *this_00;
  char in_SIL;
  zmsg_t *in_RDI;
  binarydata *in_stack_ffffffffffffffc0;
  allocator *paVar1;
  allocator local_19 [25];
  
  if (in_SIL != 'n') {
    this_00 = (string *)__cxa_allocate_exception(0x20);
    paVar1 = local_19;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (this_00,"Could not read message. Expected different type, got NDT",paVar1);
    __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  CZHelp::zmsg_popNDT(in_RDI,in_stack_ffffffffffffffc0);
  return;
}

Assistant:

void TrodesMsg::processArg(const char c, binarydata &a){
    if(c != 'n') throw std::string(PROCESSERROR "NDT");
    CZHelp::zmsg_popNDT(msg, a);
}